

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep.cpp
# Opt level: O2

ON_BoundingBox * __thiscall
ON_BrepFace::InternalFaceBoundingBox
          (ON_BoundingBox *__return_storage_ptr__,ON_BrepFace *this,bool bLazy,
          bool bUpdateCachedBBox)

{
  double dVar1;
  double dVar2;
  ON_Brep *pOVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  bool bVar7;
  int iVar8;
  ON_BrepFace *this_00;
  ON_BrepLoop *this_01;
  ON_3dPoint *pOVar9;
  undefined4 extraout_var;
  undefined7 in_register_00000011;
  int lti;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  ON_Interval pvdom;
  ON_Interval pudom;
  ON_BoundingBox pbox;
  ON_Interval local_58;
  ON_Interval local_48;
  ON_Geometry *this_02;
  
  if ((int)CONCAT71(in_register_00000011,bLazy) != 0) {
    bVar7 = ON_BoundingBox::IsNotEmpty(&this->m_bbox);
    if (bVar7) {
      uVar10 = *(undefined4 *)&(this->m_bbox).m_min.x;
      uVar11 = *(undefined4 *)((long)&(this->m_bbox).m_min.x + 4);
      uVar12 = *(undefined4 *)&(this->m_bbox).m_min.y;
      uVar13 = *(undefined4 *)((long)&(this->m_bbox).m_min.y + 4);
      uVar14 = *(undefined4 *)&(this->m_bbox).m_min.z;
      uVar15 = *(undefined4 *)((long)&(this->m_bbox).m_min.z + 4);
      uVar16 = *(undefined4 *)&(this->m_bbox).m_max.x;
      uVar17 = *(undefined4 *)((long)&(this->m_bbox).m_max.x + 4);
      uVar18 = *(undefined4 *)&(this->m_bbox).m_max.y;
      uVar19 = *(undefined4 *)((long)&(this->m_bbox).m_max.y + 4);
      uVar20 = *(undefined4 *)&(this->m_bbox).m_max.z;
      uVar21 = *(undefined4 *)((long)&(this->m_bbox).m_max.z + 4);
      goto LAB_0041b3ef;
    }
  }
  pOVar3 = this->m_brep;
  uVar10 = ON_BoundingBox::EmptyBoundingBox.m_min.x._0_4_;
  uVar11 = ON_BoundingBox::EmptyBoundingBox.m_min.x._4_4_;
  uVar12 = ON_BoundingBox::EmptyBoundingBox.m_min.y._0_4_;
  uVar13 = ON_BoundingBox::EmptyBoundingBox.m_min.y._4_4_;
  uVar14 = ON_BoundingBox::EmptyBoundingBox.m_min.z._0_4_;
  uVar15 = ON_BoundingBox::EmptyBoundingBox.m_min.z._4_4_;
  uVar16 = ON_BoundingBox::EmptyBoundingBox.m_max.x._0_4_;
  uVar17 = ON_BoundingBox::EmptyBoundingBox.m_max.x._4_4_;
  uVar18 = ON_BoundingBox::EmptyBoundingBox.m_max.y._0_4_;
  uVar19 = ON_BoundingBox::EmptyBoundingBox.m_max.y._4_4_;
  uVar20 = ON_BoundingBox::EmptyBoundingBox.m_max.z._0_4_;
  uVar21 = ON_BoundingBox::EmptyBoundingBox.m_max.z._4_4_;
  if (pOVar3 != (ON_Brep *)0x0) {
    iVar8 = this->m_face_index;
    if ((((-1 < (long)iVar8) &&
         (iVar8 < (pOVar3->m_F).super_ON_ObjectArray<ON_BrepFace>.super_ON_ClassArray<ON_BrepFace>.
                  m_count)) &&
        ((pOVar3->m_F).super_ON_ObjectArray<ON_BrepFace>.super_ON_ClassArray<ON_BrepFace>.m_a +
         iVar8 == this)) &&
       (this_00 = (ON_BrepFace *)ON_SurfaceProxy::ProxySurface(&this->super_ON_SurfaceProxy),
       uVar10 = ON_BoundingBox::EmptyBoundingBox.m_min.x._0_4_,
       uVar11 = ON_BoundingBox::EmptyBoundingBox.m_min.x._4_4_,
       uVar12 = ON_BoundingBox::EmptyBoundingBox.m_min.y._0_4_,
       uVar13 = ON_BoundingBox::EmptyBoundingBox.m_min.y._4_4_,
       uVar14 = ON_BoundingBox::EmptyBoundingBox.m_min.z._0_4_,
       uVar15 = ON_BoundingBox::EmptyBoundingBox.m_min.z._4_4_,
       uVar16 = ON_BoundingBox::EmptyBoundingBox.m_max.x._0_4_,
       uVar17 = ON_BoundingBox::EmptyBoundingBox.m_max.x._4_4_,
       uVar18 = ON_BoundingBox::EmptyBoundingBox.m_max.y._0_4_,
       uVar19 = ON_BoundingBox::EmptyBoundingBox.m_max.y._4_4_,
       uVar20 = ON_BoundingBox::EmptyBoundingBox.m_max.z._0_4_,
       uVar21 = ON_BoundingBox::EmptyBoundingBox.m_max.z._4_4_,
       this_00 != this && this_00 != (ON_BrepFace *)0x0)) {
      pbox.m_min.x = (double)CONCAT44(ON_BoundingBox::NanBoundingBox.m_min.x._4_4_,
                                      ON_BoundingBox::NanBoundingBox.m_min.x._0_4_);
      pbox.m_min.y = (double)CONCAT44(ON_BoundingBox::NanBoundingBox.m_min.y._4_4_,
                                      ON_BoundingBox::NanBoundingBox.m_min.y._0_4_);
      pbox.m_max.y = ON_BoundingBox::NanBoundingBox.m_max.y;
      pbox.m_max.z = ON_BoundingBox::NanBoundingBox.m_max.z;
      pbox.m_min.z = ON_BoundingBox::NanBoundingBox.m_min.z;
      pbox.m_max.x = ON_BoundingBox::NanBoundingBox.m_max.x;
      iVar8 = (this->m_li).m_count;
      lti = 0;
      if (iVar8 < 1) {
        iVar8 = 0;
        lti = 0;
      }
      for (; iVar8 != lti; lti = lti + 1) {
        this_01 = Loop(this,lti);
        if ((this_01 != (ON_BrepLoop *)0x0) && (this_01->m_type == outer)) {
          (*(this->m_brep->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x27])
                    (this->m_brep,this_01,1);
          bVar7 = ON_BoundingBox::IsValid(&pbox);
          bVar7 = ON_Geometry::GetBoundingBox(&this_01->super_ON_Geometry,&pbox,bVar7);
          if (!bVar7) {
            pbox.m_max.y = ON_BoundingBox::UnsetBoundingBox.m_max.y;
            pbox.m_max.z = ON_BoundingBox::UnsetBoundingBox.m_max.z;
            pbox.m_min.z = ON_BoundingBox::UnsetBoundingBox.m_min.z;
            pbox.m_max.x = ON_BoundingBox::UnsetBoundingBox.m_max.x;
            pbox.m_min.x = ON_BoundingBox::UnsetBoundingBox.m_min.x;
            pbox.m_min.y = ON_BoundingBox::UnsetBoundingBox.m_min.y;
          }
          break;
        }
      }
      dVar6 = ON_BoundingBox::NanBoundingBox.m_max.z;
      dVar5 = ON_BoundingBox::NanBoundingBox.m_max.x;
      dVar4 = ON_BoundingBox::NanBoundingBox.m_min.z;
      dVar1 = (double)CONCAT44(ON_BoundingBox::NanBoundingBox.m_min.x._4_4_,
                               ON_BoundingBox::NanBoundingBox.m_min.x._0_4_);
      dVar2 = (double)CONCAT44(ON_BoundingBox::NanBoundingBox.m_min.y._4_4_,
                               ON_BoundingBox::NanBoundingBox.m_min.y._0_4_);
      (__return_storage_ptr__->m_max).y = ON_BoundingBox::NanBoundingBox.m_max.y;
      (__return_storage_ptr__->m_max).z = dVar6;
      (__return_storage_ptr__->m_min).z = dVar4;
      (__return_storage_ptr__->m_max).x = dVar5;
      (__return_storage_ptr__->m_min).x = dVar1;
      (__return_storage_ptr__->m_min).y = dVar2;
      bVar7 = ON_BoundingBox::IsNotEmpty(&pbox);
      if (bVar7) {
        pOVar9 = ON_BoundingBox::operator[](&pbox,0);
        dVar1 = pOVar9->x;
        pOVar9 = ON_BoundingBox::operator[](&pbox,1);
        ON_Interval::ON_Interval(&pudom,dVar1,pOVar9->x);
        pOVar9 = ON_BoundingBox::operator[](&pbox,0);
        dVar1 = pOVar9->y;
        pOVar9 = ON_BoundingBox::operator[](&pbox,1);
        dVar2 = pOVar9->y;
        uVar10 = SUB84(dVar2,0);
        uVar11 = (undefined4)((ulong)dVar2 >> 0x20);
        ON_Interval::ON_Interval(&pvdom,dVar1,dVar2);
        dVar1 = ON_Interval::Length(&pudom);
        ON_Interval::Expand(&pudom,dVar1 * 0.1);
        dVar1 = ON_Interval::Length(&pvdom);
        ON_Interval::Expand(&pvdom,dVar1 * 0.1);
        (*(this->super_ON_SurfaceProxy).super_ON_Surface.super_ON_Geometry.super_ON_Object.
          _vptr_ON_Object[0x26])(this,0);
        local_58.m_t[1] = (double)CONCAT44(uVar11,uVar10);
        (*(this->super_ON_SurfaceProxy).super_ON_Surface.super_ON_Geometry.super_ON_Object.
          _vptr_ON_Object[0x26])(this,1);
        local_48.m_t[1] = (double)CONCAT44(uVar11,uVar10);
        ON_Interval::Intersection(&pudom,&local_58);
        ON_Interval::Intersection(&pvdom,&local_48);
        bVar7 = ON_BoundingBox::IsValid(&pbox);
        if ((bVar7) &&
           ((bVar7 = ON_Interval::Includes(&local_58,&pudom,true), bVar7 ||
            (bVar7 = ON_Interval::Includes(&local_48,&pvdom,true), bVar7)))) {
          iVar8 = (*(this->super_ON_SurfaceProxy).super_ON_Surface.super_ON_Geometry.super_ON_Object
                    ._vptr_ON_Object[0x24])(this);
          this_02 = (ON_Geometry *)CONCAT44(extraout_var,iVar8);
          if (this_02 != (ON_Geometry *)0x0) {
            bVar7 = ON_Interval::Includes(&local_58,&pudom,true);
            if (bVar7) {
              (*(this_02->super_ON_Object)._vptr_ON_Object[0x39])(this_02,0,&pudom);
            }
            bVar7 = ON_Interval::Includes(&local_48,&pvdom,true);
            if (bVar7) {
              (*(this_02->super_ON_Object)._vptr_ON_Object[0x39])(this_02,1,&pvdom);
            }
            bVar7 = ON_Geometry::GetBoundingBox(this_02,__return_storage_ptr__,false);
            dVar4 = ON_BoundingBox::NanBoundingBox.m_max.z;
            dVar2 = ON_BoundingBox::NanBoundingBox.m_max.x;
            dVar1 = ON_BoundingBox::NanBoundingBox.m_min.z;
            uVar13 = ON_BoundingBox::NanBoundingBox.m_min.y._4_4_;
            uVar12 = ON_BoundingBox::NanBoundingBox.m_min.y._0_4_;
            uVar11 = ON_BoundingBox::NanBoundingBox.m_min.x._4_4_;
            uVar10 = ON_BoundingBox::NanBoundingBox.m_min.x._0_4_;
            if (!bVar7) {
              (__return_storage_ptr__->m_max).y = ON_BoundingBox::NanBoundingBox.m_max.y;
              (__return_storage_ptr__->m_max).z = dVar4;
              (__return_storage_ptr__->m_min).z = dVar1;
              (__return_storage_ptr__->m_max).x = dVar2;
              *(undefined4 *)&(__return_storage_ptr__->m_min).x = uVar10;
              *(undefined4 *)((long)&(__return_storage_ptr__->m_min).x + 4) = uVar11;
              *(undefined4 *)&(__return_storage_ptr__->m_min).y = uVar12;
              *(undefined4 *)((long)&(__return_storage_ptr__->m_min).y + 4) = uVar13;
            }
            (*(this_02->super_ON_Object)._vptr_ON_Object[4])(this_02);
          }
        }
      }
      bVar7 = ON_BoundingBox::IsNotEmpty(__return_storage_ptr__);
      if (bVar7) {
        if (!bUpdateCachedBBox) {
          return __return_storage_ptr__;
        }
LAB_0041b706:
        dVar1 = (__return_storage_ptr__->m_min).x;
        dVar2 = (__return_storage_ptr__->m_min).y;
        dVar4 = (__return_storage_ptr__->m_min).z;
        dVar5 = (__return_storage_ptr__->m_max).x;
        dVar6 = (__return_storage_ptr__->m_max).z;
        (this->m_bbox).m_max.y = (__return_storage_ptr__->m_max).y;
        (this->m_bbox).m_max.z = dVar6;
        (this->m_bbox).m_min.z = dVar4;
        (this->m_bbox).m_max.x = dVar5;
        (this->m_bbox).m_min.x = dVar1;
        (this->m_bbox).m_min.y = dVar2;
        return __return_storage_ptr__;
      }
      bVar7 = ON_Geometry::GetBoundingBox((ON_Geometry *)this_00,__return_storage_ptr__,false);
      uVar10 = ON_BoundingBox::EmptyBoundingBox.m_min.x._0_4_;
      uVar11 = ON_BoundingBox::EmptyBoundingBox.m_min.x._4_4_;
      uVar12 = ON_BoundingBox::EmptyBoundingBox.m_min.y._0_4_;
      uVar13 = ON_BoundingBox::EmptyBoundingBox.m_min.y._4_4_;
      uVar14 = ON_BoundingBox::EmptyBoundingBox.m_min.z._0_4_;
      uVar15 = ON_BoundingBox::EmptyBoundingBox.m_min.z._4_4_;
      uVar16 = ON_BoundingBox::EmptyBoundingBox.m_max.x._0_4_;
      uVar17 = ON_BoundingBox::EmptyBoundingBox.m_max.x._4_4_;
      uVar18 = ON_BoundingBox::EmptyBoundingBox.m_max.y._0_4_;
      uVar19 = ON_BoundingBox::EmptyBoundingBox.m_max.y._4_4_;
      uVar20 = ON_BoundingBox::EmptyBoundingBox.m_max.z._0_4_;
      uVar21 = ON_BoundingBox::EmptyBoundingBox.m_max.z._4_4_;
      if (bVar7) {
        bVar7 = ON_BoundingBox::IsNotEmpty(__return_storage_ptr__);
        if (bVar7 && bUpdateCachedBBox) goto LAB_0041b706;
        uVar10 = ON_BoundingBox::EmptyBoundingBox.m_min.x._0_4_;
        uVar11 = ON_BoundingBox::EmptyBoundingBox.m_min.x._4_4_;
        uVar12 = ON_BoundingBox::EmptyBoundingBox.m_min.y._0_4_;
        uVar13 = ON_BoundingBox::EmptyBoundingBox.m_min.y._4_4_;
        uVar14 = ON_BoundingBox::EmptyBoundingBox.m_min.z._0_4_;
        uVar15 = ON_BoundingBox::EmptyBoundingBox.m_min.z._4_4_;
        uVar16 = ON_BoundingBox::EmptyBoundingBox.m_max.x._0_4_;
        uVar17 = ON_BoundingBox::EmptyBoundingBox.m_max.x._4_4_;
        uVar18 = ON_BoundingBox::EmptyBoundingBox.m_max.y._0_4_;
        uVar19 = ON_BoundingBox::EmptyBoundingBox.m_max.y._4_4_;
        uVar20 = ON_BoundingBox::EmptyBoundingBox.m_max.z._0_4_;
        uVar21 = ON_BoundingBox::EmptyBoundingBox.m_max.z._4_4_;
        if (bVar7) {
          return __return_storage_ptr__;
        }
      }
    }
  }
LAB_0041b3ef:
  *(undefined4 *)&(__return_storage_ptr__->m_max).y = uVar18;
  *(undefined4 *)((long)&(__return_storage_ptr__->m_max).y + 4) = uVar19;
  *(undefined4 *)&(__return_storage_ptr__->m_max).z = uVar20;
  *(undefined4 *)((long)&(__return_storage_ptr__->m_max).z + 4) = uVar21;
  *(undefined4 *)&(__return_storage_ptr__->m_min).z = uVar14;
  *(undefined4 *)((long)&(__return_storage_ptr__->m_min).z + 4) = uVar15;
  *(undefined4 *)&(__return_storage_ptr__->m_max).x = uVar16;
  *(undefined4 *)((long)&(__return_storage_ptr__->m_max).x + 4) = uVar17;
  *(undefined4 *)&(__return_storage_ptr__->m_min).x = uVar10;
  *(undefined4 *)((long)&(__return_storage_ptr__->m_min).x + 4) = uVar11;
  *(undefined4 *)&(__return_storage_ptr__->m_min).y = uVar12;
  *(undefined4 *)((long)&(__return_storage_ptr__->m_min).y + 4) = uVar13;
  return __return_storage_ptr__;
}

Assistant:

const ON_BoundingBox ON_BrepFace::InternalFaceBoundingBox(bool bLazy, bool bUpdateCachedBBox) const
{
  if (bLazy && m_bbox.IsNotEmpty())
    return m_bbox;

  for (;;)
  {
    // Make sure this face is valid enough to query the trims and proxy surface
    if (nullptr == m_brep)
      break;
    if (m_face_index < 0)
      break;
    if (m_face_index >= m_brep->m_F.Count())
      break;
    if (&m_brep->m_F[m_face_index] != this)
      break;

    const ON_Surface* proxy_srf = ProxySurface();
    if (nullptr == proxy_srf)
      break;
    if (proxy_srf == this)
      break;

    ON_BoundingBox pbox = ON_BoundingBox::NanBoundingBox;
    for (int li = 0; li < LoopCount(); li++)
    {
      ON_BrepLoop* loop = Loop(li);
      if (loop && loop->m_type == ON_BrepLoop::outer)
      {
        m_brep->SetTrimBoundingBoxes(*loop, true);       // sets loop->m_pbox 
        if (false == loop->GetBoundingBox(pbox, pbox.IsValid()))
          pbox = ON_BoundingBox::UnsetBoundingBox;
        break;
      }
    }


    ON_BoundingBox face_bbox = ON_BoundingBox::NanBoundingBox;
    if (pbox.IsNotEmpty())
    {
      ON_Interval pudom(pbox[0].x, pbox[1].x);
      ON_Interval pvdom(pbox[0].y, pbox[1].y);
      // fatten up invervals to get slightly larger boxes...
      pudom.Expand(0.1 * pudom.Length());
      pvdom.Expand(0.1 * pvdom.Length());
      ON_Interval Sdom[] = { Domain(0), Domain(1) };
      // but don't let the fattened intervals extend beyond Sdom
      pudom.Intersection(Sdom[0]);
      pvdom.Intersection(Sdom[1]);
      if (pbox.IsValid() &&
        (Sdom[0].Includes(pudom, true) || Sdom[1].Includes(pvdom, true))
        )
      {
        ON_Surface* temp_srf = DuplicateSurface();
        if (nullptr != temp_srf)
        {
          if (Sdom[0].Includes(pudom, true))
            temp_srf->Trim(0, pudom);
          if (Sdom[1].Includes(pvdom, true))
            temp_srf->Trim(1, pvdom);
          if (false == temp_srf->GetBoundingBox(face_bbox, false))
            face_bbox = ON_BoundingBox::NanBoundingBox;
          delete temp_srf;
          temp_srf = nullptr;
        }
      }
    }

    if (false == face_bbox.IsNotEmpty())
    {
      if (false == proxy_srf->GetBoundingBox(face_bbox, false))
        break;
      if (false == face_bbox.IsNotEmpty())
        break;
    }

    if (bUpdateCachedBBox)
      const_cast<ON_BrepFace*>(this)->m_bbox = face_bbox;
    return face_bbox;
  }

  // ON_Brep code has always used ON_BoundingBox::EmptyBoundingBox 
  // to indicate a bounding box is not set. If it were to be written
  // in modern times, it would have used Nans.
  return ON_BoundingBox::EmptyBoundingBox;
}